

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

ui32 __thiscall mvm::test::test_instr_set::zero(test_instr_set *this)

{
  value_type_conflict3 local_14;
  test_instr_set *local_10;
  test_instr_set *this_local;
  
  local_14 = 0;
  local_10 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->call_stack,&local_14);
  return 0;
}

Assistant:

ui32 zero() {
    call_stack.push_back(0);
    return 0;
  }